

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::SolveJacobi
          (TPZMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *scratch,REAL *tol,int FromCurrent)

{
  int iVar1;
  undefined4 extraout_var;
  int64_t iVar2;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  TPZFMatrix<std::complex<long_double>_> *in_RDI;
  long in_R8;
  undefined8 in_R9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar3;
  longdouble in_ST7;
  longdouble lVar4;
  double *in_stack_00000008;
  int in_stack_00000010;
  int64_t i;
  int64_t ic;
  int64_t it;
  int64_t c;
  int64_t r;
  REAL res;
  complex<long_double> *__y;
  undefined2 uVar5;
  undefined6 in_stack_ffffffffffffff32;
  complex<long_double> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 uVar6;
  undefined1 local_a8 [8];
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff60;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffa0;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffa8;
  long local_50;
  double local_38;
  
  if (in_stack_00000010 == 0) {
    TPZFMatrix<std::complex<long_double>_>::operator=
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    (**(code **)(*in_RCX + 0x78))();
  }
  else {
    (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x28])(in_RDI,in_RCX,in_RDX,in_R9);
  }
  ::Norm(in_stack_ffffffffffffff60);
  __y = SUB108(in_ST0,0);
  uVar5 = (undefined2)((unkuint10)in_ST0 >> 0x40);
  lVar3 = in_ST7;
  local_38 = TPZExtractVal::val(in_ST0);
  iVar1 = (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar2 = TPZBaseMatrix::Cols(in_RDX);
  local_50 = 0;
  while( true ) {
    uVar6 = false;
    if (local_50 < *in_RSI) {
      uVar6 = *in_stack_00000008 <= ABS(local_38) && ABS(local_38) != *in_stack_00000008;
    }
    if ((bool)uVar6 == false) break;
    for (in_stack_ffffffffffffffa8 = (TPZFMatrix<std::complex<long_double>_> *)0x0;
        (long)in_stack_ffffffffffffffa8 < iVar2;
        in_stack_ffffffffffffffa8 =
             (TPZFMatrix<std::complex<long_double>_> *)
             ((long)&(in_stack_ffffffffffffffa8->super_TPZMatrix<std::complex<long_double>_>).
                     super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable + 1)) {
      for (in_stack_ffffffffffffffa0 = (TPZFMatrix<std::complex<long_double>_> *)0x0;
          (long)in_stack_ffffffffffffffa0 < CONCAT44(extraout_var,iVar1);
          in_stack_ffffffffffffffa0 =
               (TPZFMatrix<std::complex<long_double>_> *)
               ((long)&(in_stack_ffffffffffffffa0->super_TPZMatrix<std::complex<long_double>_>).
                       super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable + 1)) {
        in_stack_ffffffffffffff40 =
             TPZFMatrix<std::complex<long_double>_>::operator()
                       (in_RDI,CONCAT17(uVar6,in_stack_ffffffffffffff48),
                        (int64_t)in_stack_ffffffffffffff40);
        (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
          ._vptr_TPZSavable[0x24])
                  (local_a8,in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa0);
        std::operator/((complex<long_double> *)CONCAT62(in_stack_ffffffffffffff32,uVar5),__y);
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (in_RDI,CONCAT17(uVar6,in_stack_ffffffffffffff48),
                   (int64_t)in_stack_ffffffffffffff40);
        std::complex<long_double>::operator+=
                  ((complex<long_double> *)CONCAT62(in_stack_ffffffffffffff32,uVar5),__y);
      }
    }
    (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x28])(in_RDI,in_RCX,in_RDX,in_R9);
    ::Norm(in_stack_ffffffffffffff60);
    __y = SUB108(in_ST1,0);
    uVar5 = (undefined2)((unkuint10)in_ST1 >> 0x40);
    lVar4 = lVar3;
    local_38 = TPZExtractVal::val(in_ST1);
    local_50 = local_50 + 1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = in_ST7;
    in_ST7 = lVar3;
    lVar3 = lVar4;
  }
  if (in_R8 != 0) {
    TPZFMatrix<std::complex<long_double>_>::operator=
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}